

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O1

int Cut_CutFilterOne(Cut_Man_t *p,Cut_List_t *pSuperList,Cut_Cut_t *pCut)

{
  uint uVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t *pCVar3;
  uint uVar4;
  ulong uVar5;
  Cut_Cut_t **ppCVar6;
  Cut_Cut_t *pCVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar4 = *(uint *)pCut;
  if (0x1fffffff < uVar4) {
    uVar1 = uVar4 >> 0x1c;
    uVar5 = 2;
    do {
      pCVar7 = pSuperList->pHead[uVar5];
      if (pCVar7 != (Cut_Cut_t *)0x0) {
        do {
          if ((pCVar7->uSign & ~pCut->uSign) == 0) {
            if (*(uint *)pCVar7 < 0x10000000) {
LAB_0044e8b8:
              p->nCutsFilter = p->nCutsFilter + 1;
              Cut_CutRecycle(p,pCut);
              return 1;
            }
            uVar8 = 0;
            do {
              uVar10 = 0;
              do {
                uVar9 = uVar10;
                if (*(uint *)((long)&pCVar7[1].field_0x0 + uVar8 * 4) ==
                    *(uint *)(&pCut[1].field_0x0 + uVar10 * 4)) break;
                uVar10 = uVar10 + 1;
                uVar9 = (ulong)uVar1;
              } while (uVar1 != uVar10);
              if ((uint)uVar9 == uVar1) break;
              uVar8 = uVar8 + 1;
              if (uVar8 == *(uint *)pCVar7 >> 0x1c) goto LAB_0044e8b8;
            } while( true );
          }
          pCVar7 = pCVar7->pNext;
        } while (pCVar7 != (Cut_Cut_t *)0x0);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1 + 1);
  }
  uVar5 = (ulong)(uVar4 >> 0x1c);
  while( true ) {
    if (((byte)pCut->field_0x3 & 0xf) <= uVar5) {
      return 0;
    }
    pCVar7 = pSuperList->pHead[uVar5 + 1];
    if (pCVar7 == (Cut_Cut_t *)0x0) {
      pCVar2 = (Cut_Cut_t *)0x0;
    }
    else {
      pCVar2 = pCVar7->pNext;
    }
    ppCVar6 = pSuperList->pHead + uVar5 + 1;
    if (pCVar7 != (Cut_Cut_t *)0x0) break;
LAB_0044e809:
    if (ppCVar6 != pSuperList->ppTail[uVar5 + 1]) {
      __assert_fail("ppTail == pSuperList->ppTail[a]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutNode.c"
                    ,0xce,"int Cut_CutFilterOne(Cut_Man_t *, Cut_List_t *, Cut_Cut_t *)");
    }
    uVar5 = uVar5 + 1;
    if (*ppCVar6 != (Cut_Cut_t *)0x0) {
      __assert_fail("*ppTail == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutNode.c"
                    ,0xcf,"int Cut_CutFilterOne(Cut_Man_t *, Cut_List_t *, Cut_Cut_t *)");
    }
  }
  do {
    pCVar3 = pCVar2;
    if ((pCut->uSign & ~pCVar7->uSign) == 0) {
      if (0xfffffff < *(uint *)pCut) {
        uVar4 = *(uint *)pCVar7 >> 0x1c;
        uVar8 = 0;
        do {
          uVar10 = 0;
          if (0xfffffff < *(uint *)pCVar7) {
            uVar9 = 0;
            do {
              uVar10 = uVar9;
              if (*(int *)(&pCut[1].field_0x0 + uVar8 * 4) ==
                  *(int *)(&pCVar7[1].field_0x0 + uVar9 * 4)) break;
              uVar9 = uVar9 + 1;
              uVar10 = (ulong)uVar4;
            } while (uVar4 != uVar9);
          }
          if ((uint)uVar10 == uVar4) goto LAB_0044e7e8;
          uVar8 = uVar8 + 1;
        } while (uVar8 != *(uint *)pCut >> 0x1c);
      }
      p->nCutsFilter = p->nCutsFilter + 1;
      p->nNodeCuts = p->nNodeCuts + -1;
      if (pSuperList->pHead[uVar5 + 1] == pCVar7) {
        pSuperList->pHead[uVar5 + 1] = pCVar7->pNext;
      }
      if (pSuperList->ppTail[uVar5 + 1] == &pCVar7->pNext) {
        pSuperList->ppTail[uVar5 + 1] = ppCVar6;
      }
      *ppCVar6 = pCVar7->pNext;
      Cut_CutRecycle(p,pCVar7);
    }
    else {
LAB_0044e7e8:
      ppCVar6 = &pCVar7->pNext;
    }
    if (pCVar3 == (Cut_Cut_t *)0x0) goto LAB_0044e809;
    pCVar2 = pCVar3->pNext;
    pCVar7 = pCVar3;
  } while( true );
}

Assistant:

static inline int Cut_CutFilterOne( Cut_Man_t * p, Cut_List_t * pSuperList, Cut_Cut_t * pCut )
{
    Cut_Cut_t * pTemp, * pTemp2, ** ppTail;
    int a;

    // check if this cut is filtered out by smaller cuts
    for ( a = 2; a <= (int)pCut->nLeaves; a++ )
    {
        Cut_ListForEachCut( pSuperList->pHead[a], pTemp )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Cut_CutCheckDominance( pTemp, pCut ) )
            {
                p->nCutsFilter++;
                Cut_CutRecycle( p, pCut );
                return 1;
            }
        }
    }

    // filter out other cuts using this one
    for ( a = pCut->nLeaves + 1; a <= (int)pCut->nVarsMax; a++ )
    {
        ppTail = pSuperList->pHead + a;
        Cut_ListForEachCutSafe( pSuperList->pHead[a], pTemp, pTemp2 )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
            {
                ppTail = &pTemp->pNext;
                continue;
            }
            // check containment seriously
            if ( Cut_CutCheckDominance( pCut, pTemp ) )
            {
                p->nCutsFilter++;
                p->nNodeCuts--;
                // move the head
                if ( pSuperList->pHead[a] == pTemp )
                    pSuperList->pHead[a] = pTemp->pNext;
                // move the tail
                if ( pSuperList->ppTail[a] == &pTemp->pNext )
                    pSuperList->ppTail[a] = ppTail;
                // skip the given cut in the list
                *ppTail = pTemp->pNext;
                // recycle pTemp
                Cut_CutRecycle( p, pTemp );
            }
            else
                ppTail = &pTemp->pNext;
        }
        assert( ppTail == pSuperList->ppTail[a] );
        assert( *ppTail == NULL );
    }

    return 0;
}